

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::write_access_chain_value_abi_cxx11_
          (CompilerHLSL *this,uint32_t value,SmallVector<unsigned_int,_8UL> *composite_chain,
          bool enclose)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  size_t sVar4;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  byte in_R8B;
  undefined1 local_a8 [32];
  undefined1 local_88 [44];
  AccessChainMeta meta;
  undefined1 local_50 [47];
  bool enclose_local;
  SmallVector<unsigned_int,_8UL> *composite_chain_local;
  string *psStack_18;
  uint32_t value_local;
  CompilerHLSL *this_local;
  string *ret;
  
  register0x00000008 = (Variant *)CONCAT71(in_register_00000009,enclose);
  composite_chain_local._4_4_ = (uint)composite_chain;
  local_50[0x27] = in_R8B & 1;
  local_50[0x26] = '\0';
  psStack_18 = (string *)CONCAT44(in_register_00000034,value);
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  bVar2 = VectorView<unsigned_int>::empty((VectorView<unsigned_int> *)stack0xffffffffffffffd8);
  if (bVar2) {
    CompilerGLSL::to_expression_abi_cxx11_
              ((CompilerGLSL *)local_50,value,SUB41(composite_chain_local._4_4_,0));
    ::std::__cxx11::string::operator=((string *)this,(string *)local_50);
    ::std::__cxx11::string::~string((string *)local_50);
  }
  else {
    AccessChainMeta::AccessChainMeta((AccessChainMeta *)(local_88 + 0x24));
    uVar1 = composite_chain_local._4_4_;
    puVar3 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)stack0xffffffffffffffd8);
    sVar4 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)stack0xffffffffffffffd8);
    CompilerGLSL::access_chain_internal_abi_cxx11_
              ((CompilerGLSL *)local_88,value,(uint32_t *)(ulong)uVar1,(uint32_t)puVar3,
               (AccessChainFlags)sVar4,(AccessChainMeta *)0x11);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_88);
    ::std::__cxx11::string::~string((string *)local_88);
  }
  if ((local_50[0x27] & 1) != 0) {
    CompilerGLSL::enclose_expression
              ((CompilerGLSL *)local_a8,(string *)CONCAT44(in_register_00000034,value));
    ::std::__cxx11::string::operator=((string *)this,(string *)local_a8);
    ::std::__cxx11::string::~string((string *)local_a8);
  }
  return this;
}

Assistant:

string CompilerHLSL::write_access_chain_value(uint32_t value, const SmallVector<uint32_t> &composite_chain,
                                              bool enclose)
{
	string ret;
	if (composite_chain.empty())
		ret = to_expression(value);
	else
	{
		AccessChainMeta meta;
		ret = access_chain_internal(value, composite_chain.data(), uint32_t(composite_chain.size()),
		                            ACCESS_CHAIN_INDEX_IS_LITERAL_BIT | ACCESS_CHAIN_LITERAL_MSB_FORCE_ID, &meta);
	}

	if (enclose)
		ret = enclose_expression(ret);
	return ret;
}